

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O2

void __thiscall merlin::variable_set::variable_set(variable_set *this,variable *v,variable *v2)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  ulong uVar1;
  ulong *puVar2;
  size_t *psVar3;
  allocator_type local_2a;
  allocator_type local_29;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_v,2,&local_29);
  this_00 = &this->m_dlocal;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_00,2,&local_2a);
  uVar1 = v->m_label;
  if (uVar1 < v2->m_label) {
    puVar2 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    *puVar2 = uVar1;
    psVar3 = (this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *psVar3 = v->m_states;
    puVar2[1] = v2->m_label;
    psVar3[1] = v2->m_states;
  }
  else {
    puVar2 = (this->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (v2->m_label < uVar1) {
      puVar2[1] = uVar1;
      psVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      psVar3[1] = v->m_states;
      *puVar2 = v2->m_label;
      *psVar3 = v2->m_states;
    }
    else {
      *puVar2 = uVar1;
      *(this->m_dlocal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start = v->m_states;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->m_v,1);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,1);
      psVar3 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
  }
  this->m_d = psVar3;
  return;
}

Assistant:

variable_set(const variable& v, const variable& v2) :
			m_v(2), m_dlocal(2) {
		if (v.label() < v2.label()) {
			m_v[0] = v.label();
			m_dlocal[0] = v.states();
			m_v[1] = v2.label();
			m_dlocal[1] = v2.states();
			m_d = &m_dlocal[0];
		} else if (v2.label() < v.label()) {
			m_v[1] = v.label();
			m_dlocal[1] = v.states();
			m_v[0] = v2.label();
			m_dlocal[0] = v2.states();
			m_d = &m_dlocal[0];
		} else {
			m_v[0] = v.label();
			m_dlocal[0] = v.states();
			m_v.resize(1);
			m_dlocal.resize(1);
			m_d = &m_dlocal[0];
		}
	}